

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
          (ImmutableMessageFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  Type TVar2;
  ClassNameResolver *pCVar3;
  FieldGeneratorInfo *info;
  Descriptor *pDVar4;
  OneofDescriptor *pOVar5;
  char *pcVar6;
  int bitIndex;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar7;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  pointer pcVar8;
  slot_type *psVar9;
  undefined1 local_110 [16];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  AlphaNum local_c0;
  undefined1 local_90 [48];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_60;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false> local_40;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
  local_38;
  
  (this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedImmutableMessageFieldGenerator_0084dba8;
  this->descriptor_ = descriptor;
  this->message_bit_index_ = messageBitIndex;
  this->builder_bit_index_ = builderBitIndex;
  variables = &this->variables_;
  (this->variables_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this->variables_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  (((HeapOrSoo *)
   ((long)&(this->variables_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x716e90;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  this->context_ = context;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  pCVar3 = this->name_resolver_;
  SetCommonFieldVariables(descriptor,info,variables);
  pDVar4 = FieldDescriptor::message_type(descriptor);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_110,pCVar3,pDVar4,true);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [5])0x6e6c7a);
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
  }
  pDVar4 = FieldDescriptor::message_type(descriptor);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_110,pCVar3,pDVar4,false);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [13])"mutable_type");
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
  }
  TVar2 = GetType(descriptor);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_110,variables,(char (*) [17])"group_or_message");
  pcVar6 = "Message";
  if (TVar2 == TYPE_GROUP) {
    pcVar6 = "Group";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(local_110._8_8_ + 0x10),0,*(char **)(local_110._8_8_ + 0x18),(ulong)pcVar6);
  bVar1 = (descriptor->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_110,variables,(char (*) [12])0x64d889);
  pcVar6 = "";
  if (bVar1 != false) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(local_110._8_8_ + 0x10),0,*(char **)(local_110._8_8_ + 0x18),(ulong)pcVar6);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_110,variables,(char (*) [11])"on_changed");
  std::__cxx11::string::_M_replace
            ((ulong)(local_110._8_8_ + 0x10),0,*(char **)(local_110._8_8_ + 0x18),0x6346de);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_110,variables,(char (*) [11])"get_parser");
  std::__cxx11::string::_M_replace
            ((ulong)(local_110._8_8_ + 0x10),0,*(char **)(local_110._8_8_ + 0x18),0x63d586);
  bVar1 = FieldDescriptor::has_presence(descriptor);
  if (bVar1) {
    if ((descriptor->field_0x3 & 1) != 0) {
      if ((descriptor->field_0x1 & 0x10) == 0) {
        pOVar5 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar5 = (descriptor->scope_).containing_oneof;
        if (pOVar5 == (OneofDescriptor *)0x0) {
          iVar7 = 0xb31;
          goto LAB_00327cc2;
        }
      }
      if (pOVar5 == (OneofDescriptor *)0x0) {
        iVar7 = 0xb63;
LAB_00327cc2:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar7);
      }
      if ((pOVar5->field_count_ == 1) && ((pOVar5->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_110);
      }
      goto LAB_00327840;
    }
    GenerateSetBitToLocal_abi_cxx11_
              ((string *)local_110,(java *)(ulong)(uint)messageBitIndex,bitIndex);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[27]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_c0,variables,(char (*) [27])"set_has_field_bit_to_local");
    std::__cxx11::string::operator=
              ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
    iVar7 = extraout_EDX;
    if ((undefined1 *)local_110._0_8_ != local_100) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
      iVar7 = extraout_EDX_00;
    }
    GenerateGetBit_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)messageBitIndex,iVar7);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_c0,variables,(char (*) [25])"is_field_present_message");
    std::__cxx11::string::operator=
              ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
    pcVar8 = (pointer)local_100._0_8_;
    psVar9 = (slot_type *)local_110._0_8_;
    iVar7 = extraout_EDX_01;
    if ((undefined1 *)local_110._0_8_ == local_100) goto LAB_00327998;
  }
  else {
LAB_00327840:
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[27]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_110,variables,(char (*) [27])"set_has_field_bit_to_local");
    std::__cxx11::string::_M_replace
              ((ulong)(local_110._8_8_ + 0x10),0,*(char **)(local_110._8_8_ + 0x18),0x50989c);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_90,variables,(char (*) [5])0x7203be);
    local_c0.piece_._M_str = *(char **)(local_90._8_8_ + 0x10);
    local_c0.piece_._M_len = *(size_t *)(local_90._8_8_ + 0x18);
    local_90._0_8_ = (ctrl_t *)0x9;
    local_90._8_8_ = "_ != null";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_e0,(lts_20250127 *)&local_c0,(AlphaNum *)local_90,
               (AlphaNum *)local_c0.piece_._M_str);
    local_110._0_8_ = (pointer)0x18;
    local_110._8_8_ = "is_field_present_message";
    psVar9 = (slot_type *)(local_e0 + 0x10);
    if ((slot_type *)local_e0._0_8_ == psVar9) {
      local_100._24_8_ = local_e0._24_8_;
      local_100._0_8_ = local_100 + 0x10;
    }
    else {
      local_100._0_8_ = local_e0._0_8_;
    }
    local_100._17_7_ = local_e0._17_7_;
    local_100[0x10] = local_e0[0x10];
    local_100._8_8_ = local_e0._8_8_;
    local_e0._8_8_ = (AlphaNum *)0x0;
    local_e0[0x10] = '\0';
    local_38._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    local_e0._0_8_ = psVar9;
    local_48 = variables;
    local_40._M_head_impl = (basic_string_view<char,_std::char_traits<char>_> *)local_110;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              (&local_60,&local_48,(basic_string_view<char,_std::char_traits<char>_> *)local_110,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_40,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_38);
    iVar7 = extraout_EDX_02;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      iVar7 = extraout_EDX_03;
    }
    if ((slot_type *)local_e0._0_8_ == psVar9) goto LAB_00327998;
    pcVar8 = (pointer)CONCAT71(local_e0._17_7_,local_e0[0x10]);
    psVar9 = (slot_type *)local_e0._0_8_;
  }
  operator_delete(psVar9,(ulong)(pcVar8 + 1));
  iVar7 = extraout_EDX_04;
LAB_00327998:
  GenerateGetBit_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)builderBitIndex,iVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[24]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [24])"get_mutable_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  iVar7 = extraout_EDX_05;
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    iVar7 = extraout_EDX_06;
  }
  GenerateSetBit_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)builderBitIndex,iVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[24]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [24])"set_mutable_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  iVar7 = extraout_EDX_07;
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    iVar7 = extraout_EDX_08;
  }
  GenerateClearBit_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)builderBitIndex,iVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [26])"clear_mutable_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  iVar7 = extraout_EDX_09;
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    iVar7 = extraout_EDX_10;
  }
  GenerateGetBit_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)builderBitIndex,iVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [26])"get_has_field_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_c0.piece_._M_str + 0x10),(string *)local_110);
  iVar7 = extraout_EDX_11;
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    iVar7 = extraout_EDX_12;
  }
  GenerateSetBit_abi_cxx11_((string *)local_e0,(java *)(ulong)(uint)builderBitIndex,iVar7);
  local_110._0_8_ = local_e0._8_8_;
  local_110._8_8_ = local_e0._0_8_;
  local_c0.piece_._M_len = 1;
  local_c0.piece_._M_str = ";";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_90,(lts_20250127 *)local_110,&local_c0,(AlphaNum *)local_e0._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            (&local_60,variables,(char (*) [26])"set_has_field_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_60.first.field_1.slot_ + 0x10),(string *)local_90);
  iVar7 = extraout_EDX_13;
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    iVar7 = extraout_EDX_14;
  }
  if ((slot_type *)local_e0._0_8_ != (slot_type *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_,CONCAT71(local_e0._17_7_,local_e0[0x10]) + 1);
    iVar7 = extraout_EDX_15;
  }
  GenerateClearBit_abi_cxx11_((string *)local_e0,(java *)(ulong)(uint)builderBitIndex,iVar7);
  local_110._0_8_ = local_e0._8_8_;
  local_110._8_8_ = local_e0._0_8_;
  local_c0.piece_._M_len = 1;
  local_c0.piece_._M_str = ";";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_90,(lts_20250127 *)local_110,&local_c0,(AlphaNum *)local_e0._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[28]>
            (&local_60,variables,(char (*) [28])"clear_has_field_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_60.first.field_1.slot_ + 0x10),(string *)local_90);
  iVar7 = extraout_EDX_16;
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    iVar7 = extraout_EDX_17;
  }
  if ((slot_type *)local_e0._0_8_ != (slot_type *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_,CONCAT71(local_e0._17_7_,local_e0[0x10]) + 1);
    iVar7 = extraout_EDX_18;
  }
  GenerateGetBitFromLocal_abi_cxx11_((string *)local_110,(java *)(ulong)(uint)builderBitIndex,iVar7)
  ;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[29]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c0,variables,(char (*) [29])"get_has_field_bit_from_local");
  std::__cxx11::string::operator=((string *)(local_c0.piece_._M_str + 0x10),(string *)local_110);
  if ((AlphaNum *)local_110._0_8_ != (AlphaNum *)local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
  }
  return;
}

Assistant:

ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor),
      message_bit_index_(messageBitIndex),
      builder_bit_index_(builderBitIndex),
      name_resolver_(context->GetNameResolver()),
      context_(context) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor),
                      name_resolver_, &variables_, context);
}